

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

int __thiscall MeCab::anon_unknown_0::TaggerImpl::lattice_level(TaggerImpl *this)

{
  TaggerImpl *this_local;
  int local_4;
  
  if ((this->request_type_ & 8U) == 0) {
    if ((this->request_type_ & 2U) == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int TaggerImpl::lattice_level() const {
  if (request_type_ & MECAB_MARGINAL_PROB) {
    return 2;
  } else if (request_type_ & MECAB_NBEST) {
    return 1;
  } else {
    return 0;
  }
}